

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O2

bool __thiscall
webfront::http::std::experimental::net::v1::detail::posix_event::
maybe_unlock_and_signal_one<std::experimental::net::v1::detail::conditionally_enabled_mutex::scoped_lock>
          (posix_event *this,scoped_lock *lock)

{
  ulong uVar1;
  
  uVar1 = this->state_;
  this->state_ = uVar1 | 1;
  if (1 < uVar1) {
    conditionally_enabled_mutex::scoped_lock::unlock(lock);
    pthread_cond_signal((pthread_cond_t *)this);
  }
  return 1 < uVar1;
}

Assistant:

bool maybe_unlock_and_signal_one(Lock& lock)
  {
    NET_TS_ASSERT(lock.locked());
    state_ |= 1;
    if (state_ > 1)
    {
      lock.unlock();
      ::pthread_cond_signal(&cond_); // Ignore EINVAL.
      return true;
    }
    return false;
  }